

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O0

void RunNetSpecs(int player,int buf)

{
  int type_00;
  BYTE *pBVar1;
  int type;
  BYTE *end;
  BYTE *pBStack_18;
  int len;
  BYTE *stream;
  int buf_local;
  int player_local;
  
  if ((gametic % ticdup == 0) &&
     (stream._0_4_ = buf, stream._4_4_ = player,
     pBStack_18 = FDynamicBuffer::GetData(NetSpecs[player] + buf,(int *)((long)&end + 4)),
     pBStack_18 != (BYTE *)0x0)) {
    pBVar1 = pBStack_18 + end._4_4_;
    while (pBStack_18 < pBVar1) {
      type_00 = ReadByte(&stack0xffffffffffffffe8);
      Net_DoCommand(type_00,&stack0xffffffffffffffe8,stream._4_4_);
    }
    if ((demorecording & 1U) == 0) {
      FDynamicBuffer::SetData(NetSpecs[stream._4_4_] + (int)stream,(BYTE *)0x0,0);
    }
  }
  return;
}

Assistant:

void RunNetSpecs (int player, int buf)
{
	BYTE *stream;
	int len;

	if (gametic % ticdup == 0)
	{
		stream = NetSpecs[player][buf].GetData (&len);
		if (stream)
		{
			BYTE *end = stream + len;
			while (stream < end)
			{
				int type = ReadByte (&stream);
				Net_DoCommand (type, &stream, player);
			}
			if (!demorecording)
				NetSpecs[player][buf].SetData (NULL, 0);
		}
	}
}